

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

float vkt::sr::anon_unknown_0::TextureTestUtil::computeLodFromDerivates
                (LodMode mode,float dudx,float dvdx,float dwdx,float dudy,float dvdy,float dwdy)

{
  float fVar1;
  float fVar2;
  float y;
  float fVar3;
  undefined4 local_4c;
  float mw;
  float mv;
  float mu;
  float p;
  float dwdy_local;
  float dvdy_local;
  float dudy_local;
  float dwdx_local;
  float dvdx_local;
  float dudx_local;
  LodMode mode_local;
  
  mv = 0.0;
  if (mode == LODMODE_EXACT) {
    fVar3 = deFloatSqrt(dwdx * dwdx + dudx * dudx + dvdx * dvdx);
    fVar1 = deFloatSqrt(dwdy * dwdy + dudy * dudy + dvdy * dvdy);
    mv = de::max<float>(fVar3,fVar1);
  }
  else if (mode - LODMODE_MIN_BOUND < 2) {
    fVar3 = deFloatAbs(dudx);
    fVar1 = deFloatAbs(dudy);
    fVar3 = de::max<float>(fVar3,fVar1);
    fVar1 = deFloatAbs(dvdx);
    fVar2 = deFloatAbs(dvdy);
    fVar1 = de::max<float>(fVar1,fVar2);
    fVar2 = deFloatAbs(dwdx);
    y = deFloatAbs(dwdy);
    local_4c = de::max<float>(fVar2,y);
    if (mode == LODMODE_MIN_BOUND) {
      fVar3 = de::max<float>(fVar3,fVar1);
      local_4c = de::max<float>(fVar3,local_4c);
    }
    else {
      local_4c = fVar3 + fVar1 + local_4c;
    }
    mv = local_4c;
  }
  fVar3 = deFloatLog2(mv);
  return fVar3;
}

Assistant:

float computeLodFromDerivates (LodMode mode, float dudx, float dvdx, float dwdx, float dudy, float dvdy, float dwdy)
{
	float p = 0.0f;
	switch (mode)
	{
		case LODMODE_EXACT:
			p = de::max(deFloatSqrt(dudx*dudx + dvdx*dvdx + dwdx*dwdx), deFloatSqrt(dudy*dudy + dvdy*dvdy + dwdy*dwdy));
			break;

		case LODMODE_MIN_BOUND:
		case LODMODE_MAX_BOUND:
		{
			float mu = de::max(deFloatAbs(dudx), deFloatAbs(dudy));
			float mv = de::max(deFloatAbs(dvdx), deFloatAbs(dvdy));
			float mw = de::max(deFloatAbs(dwdx), deFloatAbs(dwdy));

			p = mode == LODMODE_MIN_BOUND ? de::max(de::max(mu, mv), mw) : (mu + mv + mw);
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
	}

	return deFloatLog2(p);
}